

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalNN.cpp
# Opt level: O3

bool read_input(NaDataFile *df,uint vec_len,NaReal *vec)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  NaReal NVar5;
  
  if (df == (NaDataFile *)0x0) {
    if (vec_len == 0) {
      bVar4 = true;
    }
    else {
      uVar3 = (ulong)vec_len;
      do {
        uVar3 = uVar3 - 1;
        iVar2 = __isoc99_scanf("%lg",vec);
        bVar4 = iVar2 == 1;
        if (!bVar4) {
          return bVar4;
        }
        vec = vec + 1;
      } while (uVar3 != 0);
    }
  }
  else {
    if (read_input(NaDataFile*,unsigned_int,double*)::bFirst == '\0') {
      read_input(NaDataFile*,unsigned_int,double*)::bFirst = '\x01';
      cVar1 = (**(code **)(*(long *)df + 0x28))(df);
    }
    else {
      cVar1 = (**(code **)(*(long *)df + 0x20))(df);
    }
    if (cVar1 == '\0') {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if (vec_len != 0) {
        uVar3 = 0;
        do {
          NVar5 = (NaReal)(**(code **)(*(long *)df + 0x18))(df,uVar3 & 0xffffffff);
          vec[uVar3] = NVar5;
          uVar3 = uVar3 + 1;
        } while (vec_len != uVar3);
      }
    }
  }
  return bVar4;
}

Assistant:

bool
read_input (NaDataFile* df, unsigned vec_len, NaReal* vec)
{
  static bool	bFirst = true;
  unsigned	vec_i;

  if(NULL == df)
    {
      /* read stdin */
      for(vec_i = 0; vec_i < vec_len; ++vec_i)
	if(1 != scanf("%lg", vec + vec_i))
	  return false;
    }
  else
    {
      /* read data file */
      if(bFirst)
	{
	  bFirst = false;
	  if(!df->GoStartRecord())
	    return false;
	}
      else if(!df->GoNextRecord())
	return false;

      for(vec_i = 0; vec_i < vec_len; ++vec_i)
	vec[vec_i] = df->GetValue(vec_i);
    }

  return true;
}